

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int update_local_initial_window_size_func(void *entry,void *ptr)

{
  int iVar1;
  int iVar2;
  nghttp2_session *in_RSI;
  nghttp2_stream *in_RDI;
  uint32_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  nghttp2_stream *stream;
  nghttp2_update_window_size_arg *arg;
  int rv;
  int32_t in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffe0;
  nghttp2_session *session;
  int local_4;
  
  session = in_RSI;
  iVar1 = nghttp2_stream_update_local_initial_window_size
                    (in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    if (in_RDI->window_update_queued == '\0') {
      if (((in_RSI->streams).table[0xb6].key & 1U) == 0) {
        iVar2 = nghttp2_should_send_window_update
                          (in_RDI->local_window_size,in_RDI->recv_window_size);
        if (iVar2 != 0) {
          iVar1 = nghttp2_session_add_window_update
                            (session,(uint8_t)((uint)iVar1 >> 0x18),in_stack_ffffffffffffffe0,
                             (int32_t)((ulong)in_RSI >> 0x20));
          if (iVar1 != 0) {
            return iVar1;
          }
          in_RDI->recv_window_size = 0;
        }
        local_4 = 0;
      }
      else {
        local_4 = session_update_stream_consumed_size
                            ((nghttp2_session *)(ulong)in_stack_ffffffffffffffe0,
                             (nghttp2_stream *)in_RSI,(size_t)in_RDI);
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = nghttp2_session_add_rst_stream
                        ((nghttp2_session *)stream,unaff_retaddr_00,unaff_retaddr);
  }
  return local_4;
}

Assistant:

static int update_local_initial_window_size_func(void *entry, void *ptr) {
  int rv;
  nghttp2_update_window_size_arg *arg;
  nghttp2_stream *stream;
  arg = (nghttp2_update_window_size_arg *)ptr;
  stream = (nghttp2_stream *)entry;
  rv = nghttp2_stream_update_local_initial_window_size(
    stream, arg->new_window_size, arg->old_window_size);
  if (rv != 0) {
    return nghttp2_session_add_rst_stream(arg->session, stream->stream_id,
                                          NGHTTP2_FLOW_CONTROL_ERROR);
  }

  if (stream->window_update_queued) {
    return 0;
  }

  if (arg->session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) {
    return session_update_stream_consumed_size(arg->session, stream, 0);
  }

  if (nghttp2_should_send_window_update(stream->local_window_size,
                                        stream->recv_window_size)) {
    rv = nghttp2_session_add_window_update(arg->session, NGHTTP2_FLAG_NONE,
                                           stream->stream_id,
                                           stream->recv_window_size);
    if (rv != 0) {
      return rv;
    }

    stream->recv_window_size = 0;
  }
  return 0;
}